

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O0

void and_or_test(void)

{
  int iVar1;
  int iVar2;
  array_container_t *paVar3;
  array_container_t *array;
  array_container_t *array_00;
  char *file;
  int card_union;
  int card_inter;
  size_t x_2;
  size_t x_1;
  size_t x;
  array_container_t *TMP;
  array_container_t *BO;
  array_container_t *BI;
  array_container_t *B2;
  array_container_t *B1;
  undefined8 in_stack_ffffffffffffffa8;
  array_container_t *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  unsigned_long in_stack_ffffffffffffffc0;
  array_container_t *array1;
  ulong local_38;
  ulong local_30;
  
  fprintf(_stderr,"--- %s\n","and_or_test");
  array_container_create();
  array_container_create();
  paVar3 = array_container_create();
  array = array_container_create();
  array_00 = array_container_create();
  _assert_true(in_stack_ffffffffffffffc0,
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               (char *)in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  _assert_true(in_stack_ffffffffffffffc0,
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               (char *)in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  _assert_true(in_stack_ffffffffffffffc0,
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               (char *)in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  _assert_true(in_stack_ffffffffffffffc0,
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               (char *)in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  _assert_true(in_stack_ffffffffffffffc0,
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               (char *)in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  for (local_30 = 0; local_30 < 0x10000; local_30 = local_30 + 0x11) {
    array_container_add(in_stack_ffffffffffffffb0,
                        (uint16_t)((ulong)in_stack_ffffffffffffffa8 >> 0x30));
    array_container_add(in_stack_ffffffffffffffb0,
                        (uint16_t)((ulong)in_stack_ffffffffffffffa8 >> 0x30));
  }
  for (local_38 = 0; local_38 < 0x10000; local_38 = local_38 + 0x3e) {
    array_container_add(in_stack_ffffffffffffffb0,
                        (uint16_t)((ulong)in_stack_ffffffffffffffa8 >> 0x30));
    array_container_add(in_stack_ffffffffffffffb0,
                        (uint16_t)((ulong)in_stack_ffffffffffffffa8 >> 0x30));
  }
  for (array1 = (array_container_t *)0x0; array1 < (array_container_t *)0x10000;
      array1 = (array_container_t *)((long)&array1[0x41].array + 6)) {
    array_container_add(in_stack_ffffffffffffffb0,
                        (uint16_t)((ulong)in_stack_ffffffffffffffa8 >> 0x30));
  }
  iVar1 = array_container_cardinality(array);
  iVar2 = array_container_cardinality(paVar3);
  array_container_intersection
            (array1,(array_container_t *)CONCAT44(iVar1,iVar2),in_stack_ffffffffffffffb0);
  paVar3 = (array_container_t *)(long)iVar1;
  array_container_cardinality(array_00);
  _assert_int_equal((unsigned_long)array1,CONCAT44(iVar1,iVar2),(char *)in_stack_ffffffffffffffb0,
                    (int)((ulong)paVar3 >> 0x20));
  array_container_equals(paVar3,(array_container_t *)0x103898);
  _assert_true((unsigned_long)array1,(char *)CONCAT44(iVar1,iVar2),(char *)in_stack_ffffffffffffffb0
               ,(int)((ulong)paVar3 >> 0x20));
  array_container_union(array1,(array_container_t *)CONCAT44(iVar1,iVar2),in_stack_ffffffffffffffb0)
  ;
  file = (char *)(long)iVar2;
  array_container_cardinality(array_00);
  _assert_int_equal((unsigned_long)array1,CONCAT44(iVar1,iVar2),file,(int)((ulong)paVar3 >> 0x20));
  array_container_equals(paVar3,(array_container_t *)0x103907);
  _assert_true((unsigned_long)array1,(char *)CONCAT44(iVar1,iVar2),file,(int)((ulong)paVar3 >> 0x20)
              );
  array_container_free((array_container_t *)0x103930);
  array_container_free((array_container_t *)0x10393a);
  array_container_free((array_container_t *)0x103944);
  array_container_free((array_container_t *)0x10394e);
  array_container_free((array_container_t *)0x103958);
  return;
}

Assistant:

DEFINE_TEST(and_or_test) {
    DESCRIBE_TEST;

    array_container_t* B1 = array_container_create();
    array_container_t* B2 = array_container_create();
    array_container_t* BI = array_container_create();
    array_container_t* BO = array_container_create();
    array_container_t* TMP = array_container_create();

    assert_non_null(B1);
    assert_non_null(B2);
    assert_non_null(BI);
    assert_non_null(BO);
    assert_non_null(TMP);

    for (size_t x = 0; x < (1 << 16); x += 17) {
        array_container_add(B1, x);
        array_container_add(BI, x);
    }

    // important: 62 is not divisible by 3
    for (size_t x = 0; x < (1 << 16); x += 62) {
        array_container_add(B2, x);
        array_container_add(BI, x);
    }

    for (size_t x = 0; x < (1 << 16); x += 62 * 17) {
        array_container_add(BO, x);
    }

    const int card_inter = array_container_cardinality(BO);
    const int card_union = array_container_cardinality(BI);

    array_container_intersection(B1, B2, TMP);
    assert_int_equal(card_inter, array_container_cardinality(TMP));
    assert_true(array_container_equals(BO, TMP));

    array_container_union(B1, B2, TMP);
    assert_int_equal(card_union, array_container_cardinality(TMP));
    assert_true(array_container_equals(BI, TMP));

    array_container_free(B1);
    array_container_free(B2);
    array_container_free(BI);
    array_container_free(BO);
    array_container_free(TMP);
}